

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_create_cumulative_image.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  LBDOperator *this;
  _InputArray *p_Var4;
  char *pcVar5;
  int optionIndex;
  Mat res8;
  Mat result;
  stringstream windowNameStr;
  int local_2ec;
  allocator local_2e5;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  Mat *local_2d0;
  long alStack_2c8 [2];
  void *local_2b8;
  undefined8 uStack_2b0;
  long local_2a8;
  int local_298;
  int local_294;
  undefined4 local_290 [2];
  Mat *local_288;
  undefined8 uStack_280;
  _InputArray local_230;
  _OutputArray local_218 [4];
  _InputArray local_1b8 [5];
  ios_base local_138 [264];
  
  if (argc < 2) {
    print_usage(_stdout,argv);
  }
  else {
    local_2e4 = 0x200;
    iVar2 = 0x20;
    local_2ec = 0;
    local_2e0 = 0;
    pcVar5 = "i:m:n:p:";
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar1 = getopt_long(argc,argv,pcVar5,main::long_options,&local_2dc);
            __s1 = _optarg;
            if (iVar1 < 0x6d) break;
            if (iVar1 == 0x6d) {
              local_2e4 = atoi(_optarg);
              if (local_2e4 < 2) {
                local_2e4 = 1;
              }
              pcVar5 = "m:n:p:";
            }
            else if (iVar1 == 0x6e) {
              local_2e0 = atoi(_optarg);
              pcVar5 = "m:n:p:";
            }
            else {
              pcVar5 = "m:n:p:";
              if (iVar1 == 0x70) {
                iVar2 = atoi(_optarg);
                iVar2 = iVar2 % 2 + iVar2;
                pcVar5 = "m:n:p:";
              }
            }
          }
          if (iVar1 != 0) break;
          pcVar5 = "m:n:p:";
          if (local_2dc == 0) {
            iVar1 = strncmp(_optarg,"freak",5);
            pcVar5 = "m:n:p:";
            local_2ec = 0;
            if (iVar1 != 0) {
              iVar1 = strncmp(__s1,"brief",5);
              local_2ec = 2;
              pcVar5 = "m:n:p:";
              if (iVar1 != 0) {
                iVar1 = strncmp(__s1,"exfreak",7);
                local_2ec = (uint)(iVar1 == 0) * 2 + 1;
                pcVar5 = "m:n:p:";
              }
            }
          }
        }
        if (iVar1 != 0x3f) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option: -",0x11);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," (ignored)\n",0xb);
        pcVar5 = "m:n:p:";
      }
      pcVar5 = "m:n:p:";
    } while (iVar1 != -1);
    this = lts2::CreateLbdOperator(local_2ec,local_2e4);
    local_298 = iVar2;
    local_294 = iVar2;
    (*(this->super_LinearOperator)._vptr_LinearOperator[5])(this);
    cv::Mat::Mat((Mat *)local_218);
    lts2::LBDOperator::drawSelfInImage(this,(Mat *)local_218,local_2e0);
    local_1b8[0].sz.width = 0;
    local_1b8[0].sz.height = 0;
    local_1b8[0].flags = 0x1010000;
    uStack_280 = 0;
    local_290[0] = 0x3010000;
    local_288 = (Mat *)local_218;
    local_1b8[0].obj = (Mat *)local_218;
    p_Var4 = (_InputArray *)cv::noArray();
    cv::normalize(local_1b8,(_InputOutputArray *)local_290,0.0,1.0,0x20,-1,p_Var4);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    cv::Mat::Mat((Mat *)local_290);
    alStack_2c8[0] = 0;
    local_2d8 = 0x2010000;
    local_2d0 = (Mat *)local_290;
    cv::Mat::convertTo(local_218,(int)&local_2d8,255.0,0.0);
    std::__cxx11::string::string((string *)&local_2d8,argv[(ulong)(uint)argc - 1],&local_2e5);
    local_230.sz.width = 0;
    local_230.sz.height = 0;
    local_230.flags = 0x1010000;
    local_2a8 = 0;
    local_2b8 = (void *)0x0;
    uStack_2b0 = 0;
    local_230.obj = (Mat *)local_290;
    cv::imwrite((string *)&local_2d8,&local_230,(vector *)&local_2b8);
    if (local_2b8 != (void *)0x0) {
      operator_delete(local_2b8,local_2a8 - (long)local_2b8);
    }
    if ((long *)CONCAT44(uStack_2d4,local_2d8) != alStack_2c8) {
      operator_delete((long *)CONCAT44(uStack_2d4,local_2d8),alStack_2c8[0] + 1);
    }
    cv::Mat::~Mat((Mat *)local_290);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    cv::Mat::~Mat((Mat *)local_218);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int M = 512;
  int normalize = 0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:m:n:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      break;
      
    case 'm':
      M = MAX(1, atoi(optarg));
      break;

    case 'n':
      normalize = atoi(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "m:n:p:", long_options, &optionIndex);
  }

  cv::Size patchSize(pside,pside);
  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType, M);
  LBD->initWithPatchSize(patchSize);

  cv::Mat result;
  LBD->drawSelfInImage(result, normalize);
  cv::normalize(result, result, 0.0, 1.0, cv::NORM_MINMAX);

  std::stringstream windowNameStr;

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}